

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxUnaryNotBoolean::Resolve(FxUnaryNotBoolean *this,FCompileContext *ctx)

{
  BYTE BVar1;
  PString *pPVar2;
  PBool *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  FxBoolCast *this_00;
  FxExpression *pFVar5;
  FScriptPosition *other;
  bool bVar6;
  FString local_30;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->Operand != (FxExpression *)0x0) {
    iVar4 = (*this->Operand->_vptr_FxExpression[2])();
    pFVar5 = (FxExpression *)CONCAT44(extraout_var,iVar4);
    this->Operand = pFVar5;
    if (pFVar5 != (FxExpression *)0x0) {
      if (pFVar5->ValueType != (PType *)TypeBool) {
        this_00 = (FxBoolCast *)FMemArena::Alloc(&FxAlloc,0x38);
        pFVar5 = this->Operand;
        (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370
        ;
        FScriptPosition::FScriptPosition
                  (&(this_00->super_FxExpression).ScriptPosition,&pFVar5->ScriptPosition);
        (this_00->super_FxExpression).isresolved = false;
        (this_00->super_FxExpression).NeedResult = true;
        (this_00->super_FxExpression).ExprType = EFX_BoolCast;
        (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxBoolCast_0070b548;
        this_00->basex = pFVar5;
        (this_00->super_FxExpression).ValueType = (PType *)TypeBool;
        this_00->NeedValue = true;
        this->Operand = (FxExpression *)this_00;
        pFVar5 = FxBoolCast::Resolve(this_00,ctx);
        this->Operand = pFVar5;
        if (pFVar5 == (FxExpression *)0x0) goto LAB_005228c3;
      }
      iVar4 = (*pFVar5->_vptr_FxExpression[3])(pFVar5);
      if ((char)iVar4 != '\0') {
        pPVar2 = (PString *)this->Operand[1]._vptr_FxExpression;
        other = &this->Operand[1].ScriptPosition;
        if (pPVar2 == TypeString) {
          FString::AttachToOther(&local_30,&other->FileName);
        }
        else {
          local_30.Chars = (other->FileName).Chars;
        }
        BVar1 = (pPVar2->super_PBasicType).super_PType.RegType;
        if (BVar1 == '\x01') {
          bVar6 = (bool)(-((double)local_30.Chars != 0.0) & 1);
        }
        else if (BVar1 == '\0') {
          bVar6 = (int)local_30.Chars != 0;
        }
        else {
          bVar6 = false;
        }
        if (pPVar2 == TypeString) {
          FString::~FString(&local_30);
        }
        pFVar5 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
        pFVar5->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
        FScriptPosition::FScriptPosition
                  (&pFVar5->ScriptPosition,&(this->super_FxExpression).ScriptPosition);
        pFVar5->NeedResult = true;
        pFVar5->ExprType = EFX_Constant;
        pFVar5->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0070d3e8;
        pPVar3 = TypeBool;
        pFVar5[1]._vptr_FxExpression = (_func_int **)TypeBool;
        pFVar5->ValueType = (PType *)pPVar3;
        *(uint *)&pFVar5[1].ScriptPosition.FileName.Chars = (uint)(bVar6 ^ 1);
        pFVar5->isresolved = true;
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        return pFVar5;
      }
      (this->super_FxExpression).ValueType = (PType *)TypeBool;
      return &this->super_FxExpression;
    }
  }
LAB_005228c3:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxUnaryNotBoolean::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Operand, ctx);

	if (Operand->ValueType != TypeBool)
	{
		Operand = new FxBoolCast(Operand);
		SAFE_RESOLVE(Operand, ctx);
	}

	if (Operand->isConstant())
	{
		bool result = !static_cast<FxConstant *>(Operand)->GetValue().GetBool();
		FxExpression *e = new FxConstant(result, ScriptPosition);
		delete this;
		return e;
	}

	ValueType = TypeBool;
	return this;
}